

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Nodes_EmptyNodeType_Test::TestBody(Nodes_EmptyNodeType_Test *this)

{
  node_type n;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  nStack_48;
  
  nStack_48.alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
  super__Optional_payload<std::allocator<int>,_true,_false,_false>.
  super__Optional_payload_base<std::allocator<int>_>._M_engaged = false;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::destroy(&nStack_48);
  return;
}

Assistant:

TEST(Nodes, EmptyNodeType) {
  using node_type = StringTable::node_type;
  node_type n;
  EXPECT_FALSE(n);
  EXPECT_TRUE(n.empty());

  EXPECT_TRUE((std::is_same<node_type::allocator_type,
                            StringTable::allocator_type>::value));
}